

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDebugTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::SyncLabelCase::iterate(SyncLabelCase *this)

{
  ostringstream *poVar1;
  bool bVar2;
  int iVar3;
  deUint32 err;
  deBool dVar4;
  undefined4 extraout_var;
  undefined8 uVar6;
  size_t sVar7;
  NotSupportedError *this_00;
  char *description;
  qpTestResult testResult;
  TestContext *this_01;
  int outlen;
  char buffer [64];
  int local_1ec;
  char local_1e8 [60];
  uint uStack_1ac;
  undefined1 local_1a8 [120];
  ios_base local_130 [264];
  long lVar5;
  
  bVar2 = isKHRDebugSupported((this->super_TestCase).m_context);
  if (!bVar2) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"GL_KHR_debug is not supported","isKHRDebugSupported(m_context)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDebugTests.cpp"
               ,0x728);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar3);
  local_1ec = -1;
  uVar6 = (**(code **)(lVar5 + 0x640))(0x9117,0);
  err = (**(code **)(lVar5 + 0x800))();
  glu::checkError(err,"fenceSync",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fDebugTests.cpp"
                  ,0x730);
  (**(code **)(lVar5 + 0xfc8))(uVar6,0xffffffff,"This is a debug label");
  builtin_strncpy(local_1e8 + 0x30,"XXXXXXXXXXXX",0xc);
  uStack_1ac = 0x58585858;
  builtin_strncpy(local_1e8 + 0x20,"XXXXXXXXXXXXXXXX",0x10);
  builtin_strncpy(local_1e8 + 0x10,"XXXXXXXXXXXXXXXX",0x10);
  builtin_strncpy(local_1e8,"XXXXXXXXXXXXXXXX",0x10);
  (**(code **)(lVar5 + 0x960))(uVar6,0x40,&local_1ec);
  if (local_1ec == 0) {
    this_01 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Failed to query debug label from object";
  }
  else {
    dVar4 = deStringEqual("This is a debug label",local_1e8);
    if (dVar4 != 0) {
      local_1a8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      poVar1 = (ostringstream *)(local_1a8 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"Query returned string: \"",0x18);
      sVar7 = strlen(local_1e8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,local_1e8,sVar7);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\"",1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_130);
      this_01 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
      goto LAB_013c0566;
    }
    uStack_1ac = uStack_1ac & 0xffffff;
    local_1a8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar1 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"Query returned wrong string: expected \"",0x27);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"This is a debug label",0x15);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\" but got \"",0xb);
    sVar7 = strlen(local_1e8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,local_1e8,sVar7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\"",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_130);
    this_01 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Query returned wrong label";
  }
  testResult = QP_TEST_RESULT_FAIL;
LAB_013c0566:
  tcu::TestContext::setTestResult(this_01,testResult,description);
  (**(code **)(lVar5 + 0x478))(uVar6);
  return STOP;
}

Assistant:

SyncLabelCase::IterateResult SyncLabelCase::iterate (void)
{
	TCU_CHECK_AND_THROW(NotSupportedError, isKHRDebugSupported(m_context), "GL_KHR_debug is not supported");

	const glw::Functions&	gl			= m_context.getRenderContext().getFunctions();
	const char*	const		msg			= "This is a debug label";
	int						outlen		= -1;
	char					buffer[64];

	glw::GLsync				sync		= gl.fenceSync(GL_SYNC_GPU_COMMANDS_COMPLETE, 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "fenceSync");

	gl.objectPtrLabel(sync, -1, msg);

	deMemset(buffer, 'X', sizeof(buffer));
	gl.getObjectPtrLabel(sync, sizeof(buffer), &outlen, buffer);

	if (outlen == 0)
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Failed to query debug label from object");
	else if (deStringEqual(msg, buffer))
	{
		m_testCtx.getLog() << TestLog::Message << "Query returned string: \"" << buffer << "\"" << TestLog::EndMessage;
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		buffer[63] = '\0'; // make sure buffer is null terminated before printing
		m_testCtx.getLog() << TestLog::Message << "Query returned wrong string: expected \"" << msg << "\" but got \"" << buffer << "\"" << TestLog::EndMessage;
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Query returned wrong label");
	}

	gl.deleteSync(sync);

	return STOP;
}